

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O0

void renderGui(double cpuDt,double gpuDt)

{
  double dVar1;
  bool bVar2;
  ImDrawData *draw_data;
  char *local_978;
  char *local_960;
  char local_948 [8];
  char path [1024];
  char name_1 [64];
  char name [64];
  uint local_4bc;
  char *pcStack_4b8;
  int i;
  char *eMethods [2];
  ImVec2 local_4a0;
  ImVec2 local_498;
  ImVec2 local_490;
  ImVec2 local_488;
  ImVec2 local_480;
  ImVec2 local_478;
  ImVec2 local_470;
  char local_468 [8];
  char buf [1024];
  ImVec2 local_60;
  char *local_58;
  char *aaItems [5];
  ImVec2 local_28;
  ImVec2 local_20;
  double local_18;
  double gpuDt_local;
  double cpuDt_local;
  
  local_18 = gpuDt;
  gpuDt_local = cpuDt;
  (*glad_glBindFramebuffer)(0x8ca9,g_gl.framebuffers[0]);
  (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[1]);
  (*glad_glViewport)(0,0,g_app.viewer.w,g_app.viewer.h);
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4000);
  (*glad_glUseProgram)(g_gl.programs[0]);
  (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
  (*glad_glDrawArrays)(5,0,4);
  if ((g_app.viewer.hud & 1U) != 0) {
    ImGui_ImplGlfwGL3_NewFrame();
    ImVec2::ImVec2(&local_20,270.0,10.0);
    ImVec2::ImVec2(&local_28,0.0,0.0);
    ImGui::SetNextWindowPos(&local_20,0,&local_28);
    ImVec2::ImVec2((ImVec2 *)(aaItems + 4),250.0,120.0);
    ImGui::SetNextWindowSize((ImVec2 *)(aaItems + 4),0);
    ImGui::Begin("Framebuffer",(bool *)0x0,0);
    memcpy(&local_58,&DAT_0026f5e0,0x28);
    bVar2 = ImGui::Combo("AA",&g_framebuffer.aa,&local_58,5,-1);
    if (bVar2) {
      imguiSetAa();
    }
    bVar2 = ImGui::Combo("MSAA",&g_framebuffer.msaa.fixed,"Fixed",-1);
    if (bVar2) {
      imguiSetAa();
    }
    ImVec2::ImVec2(&local_60,0.0,0.0);
    bVar2 = ImGui::Button("Screenshot",&local_60);
    if (bVar2) {
      snprintf(local_468,0x400,"screenshot%03i",(ulong)(uint)renderGui::cnt);
      (*glad_glBindFramebuffer)(0x8ca8,0);
      djgt_save_glcolorbuffer_png(0x404,0x1908,local_468);
      renderGui::cnt = renderGui::cnt + 1;
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2(&local_470,0.0,0.0);
    bVar2 = ImGui::Button("Record",&local_470);
    if (bVar2) {
      g_app.recorder.on = (int)((g_app.recorder.on != 0 ^ 0xffU) & 1);
    }
    if (g_app.recorder.on != 0) {
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("Recording...");
    }
    ImGui::End();
    ImVec2::ImVec2(&local_478,10.0,10.0);
    ImVec2::ImVec2(&local_480,0.0,0.0);
    ImGui::SetNextWindowPos(&local_478,0,&local_480);
    ImVec2::ImVec2(&local_488,250.0,120.0);
    ImGui::SetNextWindowSize(&local_488,0);
    ImGui::Begin("Camera",(bool *)0x0,0);
    bVar2 = ImGui::SliderFloat("FOVY",&g_camera.fovy,1.0,179.0,"%.3f",1.0);
    if (bVar2) {
      configureCatmullClarkProgram();
    }
    bVar2 = ImGui::SliderFloat("zNear",&g_camera.zNear,0.01,100.0,"%.3f",1.0);
    if ((bVar2) && (g_camera.zFar <= g_camera.zNear)) {
      g_camera.zNear = g_camera.zFar - 0.01;
    }
    bVar2 = ImGui::SliderFloat("zFar",&g_camera.zFar,1.0,1500.0,"%.3f",1.0);
    if ((bVar2) && (g_camera.zFar <= g_camera.zNear)) {
      g_camera.zFar = g_camera.zNear + 0.01;
    }
    ImGui::End();
    ImVec2::ImVec2(&local_490,10.0,140.0);
    ImVec2::ImVec2(&local_498,0.0,0.0);
    ImGui::SetNextWindowPos(&local_490,0,&local_498);
    ImVec2::ImVec2(&local_4a0,510.0,580.0);
    ImGui::SetNextWindowSize(&local_4a0,0);
    ImGui::Begin("Patch",(bool *)0x0,0);
    pcStack_4b8 = "Tessellation Shader";
    eMethods[0] = "Geometry Shader";
    if (1.0 <= gpuDt_local) {
      local_960 = " s";
      dVar1 = gpuDt_local;
    }
    else {
      local_960 = "ms";
      dVar1 = gpuDt_local * 1000.0;
    }
    ImGui::Text("CPU_dt: %.3f %s",dVar1,local_960);
    ImGui::SameLine(0.0,-1.0);
    if (1.0 <= local_18) {
      local_978 = " s";
      dVar1 = local_18;
    }
    else {
      local_978 = "ms";
      dVar1 = local_18 * 1000.0;
    }
    ImGui::Text("GPU_dt: %.3f %s",dVar1,local_978);
    bVar2 = ImGui::Combo("Method",&g_patch.method,&stack0xfffffffffffffb48,2,-1);
    if (bVar2) {
      loadCatmullClarkProgram();
      g_patch.flags.reset = true;
    }
    ImGui::Text("flags: ");
    ImGui::SameLine(0.0,-1.0);
    bVar2 = ImGui::Checkbox("uniform",&g_patch.flags.uniform);
    if (bVar2) {
      loadCatmullClarkProgram();
    }
    ImGui::SameLine(0.0,-1.0);
    bVar2 = ImGui::Checkbox("cull",&g_patch.flags.cull);
    if (bVar2) {
      loadCatmullClarkProgram();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::Checkbox("wire",&g_patch.flags.wire);
    ImGui::SameLine(0.0,-1.0);
    bVar2 = ImGui::Checkbox("freeze",&g_patch.flags.freeze);
    if (bVar2) {
      loadCatmullClarkProgram();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::Checkbox("net",&g_patch.flags.net);
    bVar2 = ImGui::SliderInt("PatchSubdLevel",&g_patch.gpuSubd,0,6,"%d");
    if (bVar2) {
      loadCatmullClarkProgram();
      g_patch.flags.reset = true;
    }
    if ((g_patch.flags.uniform & 1U) == 0) {
      bVar2 = ImGui::SliderFloat("ScreenRes",&g_patch.primitivePixelLengthTarget,1.0,64.0,"%.3f",1.0
                                );
      if (bVar2) {
        configureCatmullClarkProgram();
      }
    }
    else {
      bVar2 = ImGui::SliderInt("SubdLevel",&g_patch.uniformSubd,0,0xf,"%d");
      if (bVar2) {
        loadCatmullClarkProgram();
      }
    }
    ImGui::Text("control patch vertices:");
    for (local_4bc = 0; (int)local_4bc < 0x10; local_4bc = local_4bc + 1) {
      sprintf(name_1 + 0x38,"v%02i",(ulong)local_4bc);
      bVar2 = ImGui::SliderFloat3(name_1 + 0x38,&g_patch.vertices[(int)local_4bc].x,-4.0,4.0,"%.3f",
                                  1.0);
      if (bVar2) {
        loadPatchBuffer();
      }
    }
    ImGui::End();
    ImGui::Render();
    draw_data = ImGui::GetDrawData();
    ImGui_ImplGlfwGL3_RenderDrawData(draw_data);
  }
  if (g_app.recorder.on != 0) {
    (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[0]);
    sprintf(path + 0x3f8,"capture_%02i_%09i",(ulong)(uint)g_app.recorder.capture,
            (ulong)(uint)g_app.recorder.frame);
    strcat2(local_948,g_app.dir.output,path + 0x3f8);
    djgt_save_glcolorbuffer_bmp(0x8ce0,0x1907,local_948);
    g_app.recorder.frame = g_app.recorder.frame + 1;
  }
  (*glad_glBindFramebuffer)(0x8ca9,0);
  (*glad_glBindFramebuffer)(0x8ca8,0);
  return;
}

Assistant:

void renderGui(double cpuDt, double gpuDt)
{
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_SCENE]);
    glViewport(0, 0, g_app.viewer.w, g_app.viewer.h);
    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);

    // post process the scene framebuffer
    glUseProgram(g_gl.programs[PROGRAM_VIEWER]);
    glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    // draw HUD
    if (g_app.viewer.hud) {
        // ImGui
        ImGui_ImplGlfwGL3_NewFrame();
        // Viewer Widgets
        ImGui::SetNextWindowPos(ImVec2(270, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Framebuffer");
        {
            const char* aaItems[] = {
                "None",
                "MSAA x2",
                "MSAA x4",
                "MSAA x8",
                "MSAA x16"
            };
            if (ImGui::Combo("AA", &g_framebuffer.aa, aaItems, BUFFER_SIZE(aaItems)))
                imguiSetAa();
            if (ImGui::Combo("MSAA", &g_framebuffer.msaa.fixed, "Fixed\0Random\0\0"))
                imguiSetAa();
            if (ImGui::Button("Screenshot")) {
                static int cnt = 0;
                char buf[1024];

                snprintf(buf, 1024, "screenshot%03i", cnt);
                glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
                djgt_save_glcolorbuffer_png(GL_FRONT, GL_RGBA, buf);
                ++cnt;
            }
            ImGui::SameLine();
            if (ImGui::Button("Record"))
                g_app.recorder.on = !g_app.recorder.on;
            if (g_app.recorder.on) {
                ImGui::SameLine();
                ImGui::Text("Recording...");
            }
        }
        ImGui::End();
#if 0
        // Framebuffer Widgets
        ImGui::SetNextWindowPos(ImVec2(530, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Viewer");
        {
            if (ImGui::SliderFloat("Exposure", &g_app.viewer.exposure, -3.0f, 3.0f))
                configureViewerProgram();
            if (ImGui::SliderFloat("Gamma", &g_app.viewer.gamma, 1.0f, 4.0f))
                configureViewerProgram();
        }
        ImGui::End();
#endif
        // Camera Widgets
        ImGui::SetNextWindowPos(ImVec2(10, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Camera");
        {
            if (ImGui::SliderFloat("FOVY", &g_camera.fovy, 1.0f, 179.0f)) {
                configureCatmullClarkProgram();
            }
            if (ImGui::SliderFloat("zNear", &g_camera.zNear, 0.01f, 100.f)) {
                if (g_camera.zNear >= g_camera.zFar)
                    g_camera.zNear = g_camera.zFar - 0.01f;
            }
            if (ImGui::SliderFloat("zFar", &g_camera.zFar, 1.f, 1500.f)) {
                if (g_camera.zFar <= g_camera.zNear)
                    g_camera.zFar = g_camera.zNear + 0.01f;
            }
        }
        ImGui::End();
        // Subd Patch Widgets
        ImGui::SetNextWindowPos(ImVec2(10, 140)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(510, 580)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Patch");
        {
            const char* eMethods[] = {
                "Tessellation Shader",
                "Geometry Shader"
            };
            ImGui::Text("CPU_dt: %.3f %s",
                        cpuDt < 1. ? cpuDt * 1e3 : cpuDt,
                        cpuDt < 1. ? "ms" : " s");
            ImGui::SameLine();
            ImGui::Text("GPU_dt: %.3f %s",
                        gpuDt < 1. ? gpuDt * 1e3 : gpuDt,
                        gpuDt < 1. ? "ms" : " s");
            if (ImGui::Combo("Method", &g_patch.method, eMethods, BUFFER_SIZE(eMethods))) {
                loadCatmullClarkProgram();
                g_patch.flags.reset = true;
            }
            ImGui::Text("flags: ");
            ImGui::SameLine();
            if (ImGui::Checkbox("uniform", &g_patch.flags.uniform))
                loadCatmullClarkProgram();
            ImGui::SameLine();
            if (ImGui::Checkbox("cull", &g_patch.flags.cull))
                loadCatmullClarkProgram();
            ImGui::SameLine();
            ImGui::Checkbox("wire", &g_patch.flags.wire);
            ImGui::SameLine();
            if (ImGui::Checkbox("freeze", &g_patch.flags.freeze))
                loadCatmullClarkProgram();
            ImGui::SameLine();
            ImGui::Checkbox("net", &g_patch.flags.net);

            if (ImGui::SliderInt("PatchSubdLevel", &g_patch.gpuSubd, 0, 6)) {
                loadCatmullClarkProgram();
                g_patch.flags.reset = true;
            }
            if (g_patch.flags.uniform) {
                if (ImGui::SliderInt("SubdLevel", &g_patch.uniformSubd, 0, 15)) {
                    loadCatmullClarkProgram();
                }
            } else {
                if (ImGui::SliderFloat("ScreenRes", &g_patch.primitivePixelLengthTarget, 1, 64)) {
                    configureCatmullClarkProgram();
                }
            }
            ImGui::Text("control patch vertices:");
            for (int i = 0; i < BUFFER_SIZE(g_patch.vertices); ++i) {
                char name[64];

                sprintf(name, "v%02i", i);
                if (ImGui::SliderFloat3(name, &(g_patch.vertices[i].x), -4.0f, 4.0f)) {
                    loadPatchBuffer();
                }
            }
        }
        ImGui::End();

        ImGui::Render();
        ImGui_ImplGlfwGL3_RenderDrawData(ImGui::GetDrawData());
    }

    // screen recording
    if (g_app.recorder.on) {
        char name[64], path[1024];

        glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
        sprintf(name, "capture_%02i_%09i",
                g_app.recorder.capture,
                g_app.recorder.frame);
        strcat2(path, g_app.dir.output, name);
        djgt_save_glcolorbuffer_bmp(GL_COLOR_ATTACHMENT0, GL_RGB, path);
        ++g_app.recorder.frame;
    }

    // restore state
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
}